

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsWindowsPELinker::ScanDependencies
          (cmBinUtilsWindowsPELinker *this,string *file,TargetType param_2)

{
  cmRuntimeDependencyArchive *this_00;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  bool resolved;
  bool unique;
  string path;
  string origin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  needed;
  bool local_aa;
  bool local_a9;
  string local_a8;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*((this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>.
            _M_head_impl)->_vptr_cmBinUtilsWindowsPEGetRuntimeDependenciesTool[2])();
  pbVar1 = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((char)iVar3 == '\0') {
    bVar2 = false;
  }
  else {
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar4 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::LowerCase(&local_88,pbVar4);
        std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
    }
    cmsys::SystemTools::GetFilenamePath(&local_88,file);
    pbVar1 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar4 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar2 = cmRuntimeDependencyArchive::IsPreExcluded
                          ((this->super_cmBinUtilsLinker).Archive,pbVar4);
        if (!bVar2) {
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          local_aa = false;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          ResolveDependency(this,pbVar4,&local_88,&local_a8,&local_aa);
          this_00 = (this->super_cmBinUtilsLinker).Archive;
          if (local_aa == true) {
            bVar2 = cmRuntimeDependencyArchive::IsPostExcluded(this_00,&local_a8);
            if (!bVar2) {
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmRuntimeDependencyArchive::AddResolvedPath
                        ((this->super_cmBinUtilsLinker).Archive,pbVar4,&local_a8,&local_a9,&local_48
                        );
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              if (local_a9 == true) {
                iVar3 = (*(this->super_cmBinUtilsLinker)._vptr_cmBinUtilsLinker[3])
                                  (this,&local_a8,2);
                if ((char)iVar3 == '\0') {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                             local_a8.field_2._M_local_buf[0]) + 1);
                  }
                  bVar2 = false;
                  goto LAB_005471a6;
                }
              }
            }
          }
          else {
            cmRuntimeDependencyArchive::AddUnresolvedPath(this_00,pbVar4);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
      bVar2 = true;
    }
LAB_005471a6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return bVar2;
}

Assistant:

bool cmBinUtilsWindowsPELinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType /* unused */)
{
  std::vector<std::string> needed;
  if (!this->Tool->GetFileInfo(file, needed)) {
    return false;
  }
  for (auto& n : needed) {
    n = cmSystemTools::LowerCase(n);
  }
  std::string origin = cmSystemTools::GetFilenamePath(file);

  for (auto const& lib : needed) {
    if (!this->Archive->IsPreExcluded(lib)) {
      std::string path;
      bool resolved = false;
      if (!this->ResolveDependency(lib, origin, path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path)) {
          bool unique;
          this->Archive->AddResolvedPath(lib, path, unique);
          if (unique &&
              !this->ScanDependencies(path, cmStateEnums::SHARED_LIBRARY)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(lib);
      }
    }
  }

  return true;
}